

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QList<QStringView> * __thiscall
QStringView::split(QStringView *this,QStringView sep,SplitBehavior behavior,CaseSensitivity cs)

{
  long lVar1;
  QStringView sep_00;
  QStringView *in_RDX;
  QList<QStringView> *in_RDI;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  SplitBehavior in_stack_0000004c;
  undefined1 in_stack_00000050 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sep_00.m_data._4_4_ =
       (SplitBehavior)
       (SplitBehavior)
       behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
       super_QFlagsStorage<Qt::SplitBehaviorFlags>.i;
  sep_00._0_12_ = in_stack_00000050;
  (anonymous_namespace)::splitString<QList<QStringView>,QStringView>
            (in_RDX,sep_00,in_stack_0000004c,in_R8D);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QStringView> QStringView::split(QStringView sep, Qt::SplitBehavior behavior, Qt::CaseSensitivity cs) const
{
    return splitString<QList<QStringView>>(QStringView(*this), sep, behavior, cs);
}